

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_if.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  time_t tVar2;
  tm *__tp;
  char *pcVar3;
  long local_50;
  time_t time;
  string local_38 [8];
  string ANS;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::operator=(local_38,"Compile-Time Evaluation with \'if constexpr\'.");
  poVar1 = std::operator<<((ostream *)&std::cout,'\n');
  poVar1 = std::operator<<(poVar1,local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_50 = ::time((time_t *)0x0);
  tVar2 = ::time((time_t *)0x0);
  if (tVar2 == local_50) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Runtime-Evaluated:\t");
    __tp = localtime(&local_50);
    pcVar3 = asctime(__tp);
    std::operator<<(poVar1,pcVar3);
  }
  if (argc == 4) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Your CMD/Terminal Args (4) are: \"");
    poVar1 = std::operator<<(poVar1,*argv);
    poVar1 = std::operator<<(poVar1,"\", \"");
    poVar1 = std::operator<<(poVar1,argv[1]);
    poVar1 = std::operator<<(poVar1,"\", \"");
    poVar1 = std::operator<<(poVar1,argv[2]);
    poVar1 = std::operator<<(poVar1,"\", and \"");
    poVar1 = std::operator<<(poVar1,argv[3]);
    poVar1 = std::operator<<(poVar1,"\".\n");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	/*	An example of an if condition that can be 
		evaluated at compile-time. This will succeed
		with constexpr if as well as a regular if. */
	std::string ANS;
	if constexpr (9-9>2) ANS = "Compile-Time Evaluation with \'if constexpr\'.";
	else ANS = "Compile-Time Evaluation with \'if constexpr\'.";
	std::cout << '\n' << ANS << std::endl;

	/*	Two example of runtime evaluated conditions.
		These will fail with constexpr if but will
		succeed with regular if. */

	//The time is only known at runtime
	std::time_t time = std::time(NULL);
	//if constexpr (std::time (NULL) == time) {
	if (std::time (NULL) == time ) {
		std::cout << "Runtime-Evaluated:\t" <<
		std::asctime(std::localtime(&time));
	}
	//Args are only known at runtime
	//if constexpr (argc == 4) {
	if (argc == 4) {
		std::cout << "Your CMD/Terminal Args (4) are: \""
		<< argv[0] << "\", \"" << argv[1] << "\", \"" << argv[2]
		<< "\", and \"" << argv[3] << "\".\n" << std::endl;
	}
	std::cout << std::endl;
}